

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult vmaCreateAliasingImage
                   (VmaAllocator allocator,VmaAllocation allocation,
                   VkImageCreateInfo *pImageCreateInfo,VkImage *pImage)

{
  VkImage pVVar1;
  VmaVulkanFunctions *pVVar2;
  VkAllocationCallbacks *pVVar3;
  undefined8 *in_RCX;
  VkDeviceSize in_RDX;
  VmaAllocator_T *in_RDI;
  VkResult res;
  void *in_stack_ffffffffffffffb0;
  PFN_vkDestroyImage p_Var4;
  VkDevice pVVar5;
  VmaAllocation hAllocation;
  undefined4 in_stack_ffffffffffffffd0;
  VkResult local_4;
  
  *in_RCX = 0;
  if ((((*(int *)(in_RDX + 0x1c) == 0) || (*(int *)(in_RDX + 0x20) == 0)) ||
      (*(int *)(in_RDX + 0x24) == 0)) ||
     ((*(int *)(in_RDX + 0x28) == 0 || (*(int *)(in_RDX + 0x2c) == 0)))) {
    local_4 = VK_ERROR_INITIALIZATION_FAILED;
  }
  else {
    pVVar2 = VmaAllocator_T::GetVulkanFunctions(in_RDI);
    hAllocation = (VmaAllocation)pVVar2->vkCreateImage;
    pVVar5 = in_RDI->m_hDevice;
    pVVar3 = VmaAllocator_T::GetAllocationCallbacks(in_RDI);
    local_4 = (*(code *)hAllocation)(pVVar5,in_RDX,pVVar3,in_RCX);
    if (VK_ERROR_OUT_OF_HOST_MEMORY < local_4) {
      local_4 = VmaAllocator_T::BindImageMemory
                          ((VmaAllocator_T *)CONCAT44(local_4,in_stack_ffffffffffffffd0),hAllocation
                           ,in_RDX,(VkImage)pVVar5,in_stack_ffffffffffffffb0);
      if (local_4 < VK_SUCCESS) {
        pVVar2 = VmaAllocator_T::GetVulkanFunctions(in_RDI);
        p_Var4 = pVVar2->vkDestroyImage;
        pVVar5 = in_RDI->m_hDevice;
        pVVar1 = (VkImage)*in_RCX;
        pVVar3 = VmaAllocator_T::GetAllocationCallbacks(in_RDI);
        (*p_Var4)(pVVar5,pVVar1,pVVar3);
      }
      else {
        local_4 = VK_SUCCESS;
      }
    }
  }
  return local_4;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaCreateAliasingImage(
    VmaAllocator VMA_NOT_NULL allocator,
    VmaAllocation VMA_NOT_NULL allocation,
    const VkImageCreateInfo* VMA_NOT_NULL pImageCreateInfo,
    VkImage VMA_NULLABLE_NON_DISPATCHABLE* VMA_NOT_NULL pImage)
{
    VMA_ASSERT(allocator && pImageCreateInfo && pImage && allocation);

    *pImage = VK_NULL_HANDLE;

    VMA_DEBUG_LOG("vmaCreateImage");

    if (pImageCreateInfo->extent.width == 0 ||
        pImageCreateInfo->extent.height == 0 ||
        pImageCreateInfo->extent.depth == 0 ||
        pImageCreateInfo->mipLevels == 0 ||
        pImageCreateInfo->arrayLayers == 0)
    {
        return VK_ERROR_INITIALIZATION_FAILED;
    }

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    // 1. Create VkImage.
    VkResult res = (*allocator->GetVulkanFunctions().vkCreateImage)(
        allocator->m_hDevice,
        pImageCreateInfo,
        allocator->GetAllocationCallbacks(),
        pImage);
    if (res >= 0)
    {
        // 2. Bind image with memory.
        res = allocator->BindImageMemory(allocation, 0, *pImage, VMA_NULL);
        if (res >= 0)
        {
            return VK_SUCCESS;
        }
        (*allocator->GetVulkanFunctions().vkDestroyImage)(allocator->m_hDevice, *pImage, allocator->GetAllocationCallbacks());
    }
    return res;
}